

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O3

char * __thiscall QMetaEnum::valueToKey(QMetaEnum *this,quint64 value)

{
  uint uVar1;
  uint uVar2;
  QMetaObject *pQVar3;
  uint *puVar4;
  uint *puVar5;
  QMetaTypeInterface *pQVar6;
  bool bVar7;
  quint64 qVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  pQVar3 = this->mobj;
  if (pQVar3 == (QMetaObject *)0x0) {
    return (char *)0x0;
  }
  puVar4 = (this->data).d;
  uVar1 = puVar4[2];
  if ((uVar1 & 0x40) == 0) {
    if ((uVar1 & 1) == 0) {
      puVar5 = (pQVar3->d).data;
      pQVar6 = (pQVar3->d).metaTypes
               [(long)(int)puVar5[6] +
                (ulong)((int)((ulong)((long)puVar4 - (long)puVar5) >> 2) - puVar5[9]) / 5];
      if ((pQVar6 == (QMetaTypeInterface *)0x0) || ((pQVar6->flags & 0x100) == 0)) {
        bVar7 = false;
        if ((long)(int)value != value) {
          return (char *)0x0;
        }
        goto LAB_00283350;
      }
    }
    bVar7 = true;
    if (value >> 0x20 != 0) {
      return (char *)0x0;
    }
  }
  else {
    bVar7 = false;
  }
LAB_00283350:
  lVar10 = (long)(int)puVar4[3];
  if (0 < lVar10) {
    puVar5 = (pQVar3->d).data;
    uVar9 = puVar4[4];
    uVar11 = uVar9 + puVar4[3] * 2;
    do {
      uVar2 = puVar5[uVar9 + 1];
      if ((uVar1 & 0x40) == 0) {
        qVar8 = (long)(int)uVar2;
        if (bVar7) {
          qVar8 = (ulong)uVar2;
        }
      }
      else {
        qVar8 = CONCAT44(puVar5[uVar11],uVar2);
      }
      if (qVar8 == value) {
        puVar4 = (pQVar3->d).stringdata;
        return (char *)((ulong)puVar4[(long)(int)puVar5[uVar9] * 2] + (long)puVar4);
      }
      uVar9 = uVar9 + 2;
      uVar11 = uVar11 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  return (char *)0x0;
}

Assistant:

const char *QMetaEnum::valueToKey(quint64 value) const
{
    if (!mobj)
        return nullptr;

    EnumExtendMode mode = enumExtendMode(*this);
    if (!isEnumValueSuitable(value, mode))
        return nullptr;

    for (int i = 0; i < int(data.keyCount()); ++i) {
        if (value == value_helper(i, mode))
            return rawStringData(mobj, mobj->d.data[data.data() + 2 * i]);
    }
    return nullptr;
}